

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O1

wchar_t scp_send_errmsg(char *str)

{
  Backend *pBVar1;
  size_t sVar2;
  
  if (!using_sftp) {
    (*backend->vt->send)(backend,anon_var_dwarf_34748 + 9,1);
    pBVar1 = backend;
    sVar2 = strlen(str);
    (*pBVar1->vt->send)(pBVar1,str,sVar2);
  }
  return L'\0';
}

Assistant:

int scp_send_errmsg(char *str)
{
    if (using_sftp) {
        /* do nothing; we never need to send our errors to the server */
    } else {
        backend_send(backend, "\001", 1);/* scp protocol error prefix */
        backend_send(backend, str, strlen(str));
    }
    return 0;                          /* can't fail */
}